

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fScissorTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::ScissorTests::init(ScissorTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestContext *testCtx;
  RenderContext *renderCtx;
  TestNode *pTVar1;
  Vector<float,_4> local_39c;
  Vector<float,_4> local_38c;
  Vector<float,_4> local_37c;
  Vector<float,_4> local_36c;
  Vector<float,_4> local_35c;
  Vector<float,_4> local_34c;
  int local_33c;
  char *pcStack_338;
  int caseNdx;
  anon_struct_56_6_3c2798e8 cases [14];
  RenderContext *rc;
  TestContext *tc;
  ScissorTests *this_local;
  
  testCtx = gles3::Context::getTestContext((this->super_TestCaseGroup).m_context);
  renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pcStack_338 = "contained_quads";
  cases[0].name = "Triangles fully inside scissor area (single call)";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[0].desc,0.1,0.1,0.8,0.8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[0].scissor.m_data + 2),0.2,0.2,0.6,0.6);
  cases[0].render.m_data[2] = 2.8026e-45;
  cases[0].render.m_data[3] = 4.2039e-44;
  cases[0]._48_8_ = anon_var_dwarf_11b4331;
  cases[1].name = "Triangles partially inside scissor area (single call)";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[1].desc,0.3,0.3,0.4,0.4);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[1].scissor.m_data + 2),0.2,0.2,0.6,0.6);
  cases[1].render.m_data[2] = 2.8026e-45;
  cases[1].render.m_data[3] = 4.2039e-44;
  cases[1]._48_8_ = anon_var_dwarf_e0baee;
  cases[2].name = "Triangle fully inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[2].desc,0.1,0.1,0.8,0.8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[2].scissor.m_data + 2),0.2,0.2,0.6,0.6);
  cases[2].render.m_data[2] = 2.8026e-45;
  cases[2].render.m_data[3] = 1.4013e-45;
  cases[2]._48_8_ = anon_var_dwarf_e0bb0e;
  cases[3].name = "Triangle fully covering scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[3].desc,0.4,0.4,0.2,0.2);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[3].scissor.m_data + 2),0.2,0.2,0.6,0.6);
  cases[3].render.m_data[2] = 2.8026e-45;
  cases[3].render.m_data[3] = 1.4013e-45;
  cases[3]._48_8_ = anon_var_dwarf_e0bb2e;
  cases[4].name = "Triangle partially inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[4].desc,0.4,0.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[4].scissor.m_data + 2),0.0,0.0,1.0,1.0);
  cases[4].render.m_data[2] = 2.8026e-45;
  cases[4].render.m_data[3] = 1.4013e-45;
  cases[4]._48_8_ = anon_var_dwarf_e0bb5a;
  cases[5].name = "Triangle with scissor area outside render target";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[5].desc,1.4,1.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[5].scissor.m_data + 2),0.0,0.0,0.6,0.6);
  cases[5].render.m_data[2] = 2.8026e-45;
  cases[5].render.m_data[3] = 1.4013e-45;
  cases[5]._48_8_ = anon_var_dwarf_e0bb86;
  cases[6].name = "Linse partially inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[6].desc,0.4,0.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[6].scissor.m_data + 2),0.0,0.0,1.0,1.0);
  cases[6].render.m_data[2] = 1.4013e-45;
  cases[6].render.m_data[3] = 4.2039e-44;
  cases[6]._48_8_ = anon_var_dwarf_e0bba6;
  cases[7].name = "Line fully inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[7].desc,0.1,0.1,0.8,0.8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[7].scissor.m_data + 2),0.2,0.2,0.6,0.6);
  cases[7].render.m_data[2] = 1.4013e-45;
  cases[7].render.m_data[3] = 1.4013e-45;
  cases[7]._48_8_ = anon_var_dwarf_e0bbc6;
  cases[8].name = "Line partially inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[8].desc,0.4,0.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[8].scissor.m_data + 2),0.0,0.0,1.0,1.0);
  cases[8].render.m_data[2] = 1.4013e-45;
  cases[8].render.m_data[3] = 1.4013e-45;
  cases[8]._48_8_ = anon_var_dwarf_e0bbda;
  cases[9].name = "Line with scissor area outside render target";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[9].desc,1.4,1.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[9].scissor.m_data + 2),0.0,0.0,0.6,0.6);
  cases[9].render.m_data[2] = 1.4013e-45;
  cases[9].render.m_data[3] = 1.4013e-45;
  cases[9]._48_8_ = anon_var_dwarf_e0bc06;
  cases[10].name = "Point fully inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[10].desc,0.1,0.1,0.8,0.8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[10].scissor.m_data + 2),0.5,0.5,0.0,0.0);
  cases[10].render.m_data[2] = 0.0;
  cases[10].render.m_data[3] = 1.4013e-45;
  cases[10]._48_8_ = anon_var_dwarf_e0bc32;
  cases[0xb].name = "Points partially inside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[0xb].desc,0.4,0.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[0xb].scissor.m_data + 2),0.0,0.0,1.0,1.0)
  ;
  cases[0xb].render.m_data[2] = 0.0;
  cases[0xb].render.m_data[3] = 4.2039e-44;
  cases[0xb]._48_8_ = anon_var_dwarf_e0bc46;
  cases[0xc].name = "Point fully outside scissor area";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[0xc].desc,0.4,0.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[0xc].scissor.m_data + 2),0.0,0.0,0.0,0.0)
  ;
  cases[0xc].render.m_data[2] = 0.0;
  cases[0xc].render.m_data[3] = 1.4013e-45;
  cases[0xc]._48_8_ = anon_var_dwarf_e0bc66;
  cases[0xd].name = "Point with scissor area outside render target";
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cases[0xd].desc,1.4,1.4,0.6,0.6);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(cases[0xd].scissor.m_data + 2),0.5,0.5,0.0,0.0)
  ;
  cases[0xd].render.m_data[2] = 0.0;
  cases[0xd].render.m_data[3] = 1.4013e-45;
  for (local_33c = 0; local_33c < 0xe; local_33c = local_33c + 1) {
    pTVar1 = deqp::gls::Functional::ScissorTestInternal::createPrimitiveTest
                       (testCtx,renderCtx,*(char **)&cases[(long)local_33c + -1].type,
                        cases[local_33c].name,(Vec4 *)&cases[local_33c].desc,
                        (Vec4 *)(cases[local_33c].scissor.m_data + 2),
                        (PrimitiveType)cases[local_33c].render.m_data[2],
                        (int)cases[local_33c].render.m_data[3]);
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
  }
  tcu::Vector<float,_4>::Vector(&local_34c,0.1,0.1,0.8,0.8);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_depth","Depth buffer clear",&local_34c,0x100);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  tcu::Vector<float,_4>::Vector(&local_35c,0.1,0.1,0.8,0.8);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_stencil","Stencil buffer clear",&local_35c,0x400);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  tcu::Vector<float,_4>::Vector(&local_36c,0.1,0.1,0.8,0.8);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_color","Color buffer clear",&local_36c,0x4000);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_fixed_buffer","Fixed point color clear",
                      CLEAR_COLOR_FIXED);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_int_buffer","Integer color clear",CLEAR_COLOR_INT);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_uint_buffer","Unsigned integer buffer clear",
                      CLEAR_COLOR_UINT);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_depth_buffer","Depth buffer clear",CLEAR_DEPTH);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_stencil_buffer","Stencil buffer clear",CLEAR_STENCIL)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_depth_stencil_buffer",
                      "Fixed point color buffer clear",CLEAR_DEPTH_STENCIL);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  tcu::Vector<float,_4>::Vector(&local_37c,0.1,0.1,0.8,0.8);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferBlitTest
                     (testCtx,renderCtx,"framebuffer_blit_center",
                      "Blit to default framebuffer, scissor away edges",&local_37c);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  tcu::Vector<float,_4>::Vector(&local_38c,0.6,0.6,0.5,0.5);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferBlitTest
                     (testCtx,renderCtx,"framebuffer_blit_corner",
                      "Blit to default framebuffer, scissor all but a corner",&local_38c);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  tcu::Vector<float,_4>::Vector(&local_39c,1.6,0.6,0.5,0.5);
  pTVar1 = deqp::gls::Functional::ScissorTestInternal::createFramebufferBlitTest
                     (testCtx,renderCtx,"framebuffer_blit_none",
                      "Blit to default framebuffer, scissor area outside screen",&local_39c);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ScissorTests::init (void)
{
	using tcu::Vec4;
	using namespace gls::Functional::ScissorTestInternal;

	tcu::TestContext&		tc = m_context.getTestContext();
	glu::RenderContext&		rc = m_context.getRenderContext();

	const struct
	{
		const char*			name;
		const char*			desc;
		const tcu::Vec4		scissor;
		const tcu::Vec4		render;
		const PrimitiveType	type;
		const int			primitives;
	} cases[] =
	{
		{ "contained_quads",		"Triangles fully inside scissor area (single call)",		Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	30 },
		{ "partial_quads",			"Triangles partially inside scissor area (single call)",	Vec4(0.3f, 0.3f, 0.4f, 0.4f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	30 },
		{ "contained_tri",			"Triangle fully inside scissor area",						Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "enclosing_tri",			"Triangle fully covering scissor area",						Vec4(0.4f, 0.4f, 0.2f, 0.2f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "partial_tri",			"Triangle partially inside scissor area",					Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), TRIANGLE,	1  },
		{ "outside_render_tri",		"Triangle with scissor area outside render target",			Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "partial_lines",			"Linse partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), LINE,		30 },
		{ "contained_line",			"Line fully inside scissor area",							Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), LINE,		1  },
		{ "partial_line",			"Line partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), LINE,		1  },
		{ "outside_render_line",	"Line with scissor area outside render target",				Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.6f, 0.6f), LINE,		1  },
		{ "contained_point",		"Point fully inside scissor area",							Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.5f, 0.5f, 0.0f, 0.0f), POINT,		1  },
		{ "partial_points",			"Points partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), POINT,		30 },
		{ "outside_point",			"Point fully outside scissor area",							Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.0f, 0.0f), POINT,		1  },
		{ "outside_render_point",	"Point with scissor area outside render target",			Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.5f, 0.5f, 0.0f, 0.0f),	POINT,		1  }
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		addChild(createPrimitiveTest(tc,
									 rc,
									 cases[caseNdx].name,
									 cases[caseNdx].desc,
									 cases[caseNdx].scissor,
									 cases[caseNdx].render,
									 cases[caseNdx].type,
									 cases[caseNdx].primitives));
	}

	addChild(createClearTest(tc, rc, "clear_depth",		"Depth buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_DEPTH_BUFFER_BIT));
	addChild(createClearTest(tc, rc, "clear_stencil",	"Stencil buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_STENCIL_BUFFER_BIT));
	addChild(createClearTest(tc, rc, "clear_color",		"Color buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_COLOR_BUFFER_BIT));

	addChild(createFramebufferClearTest(tc, rc, "clear_fixed_buffer",			"Fixed point color clear",			CLEAR_COLOR_FIXED));
	addChild(createFramebufferClearTest(tc, rc, "clear_int_buffer",				"Integer color clear",				CLEAR_COLOR_INT));
	addChild(createFramebufferClearTest(tc, rc, "clear_uint_buffer",			"Unsigned integer buffer clear",	CLEAR_COLOR_UINT));
	addChild(createFramebufferClearTest(tc, rc, "clear_depth_buffer",			"Depth buffer clear",				CLEAR_DEPTH));
	addChild(createFramebufferClearTest(tc, rc, "clear_stencil_buffer",			"Stencil buffer clear",				CLEAR_STENCIL));
	addChild(createFramebufferClearTest(tc, rc, "clear_depth_stencil_buffer",	"Fixed point color buffer clear",	CLEAR_DEPTH_STENCIL));

	addChild(createFramebufferBlitTest(tc, rc, "framebuffer_blit_center",	"Blit to default framebuffer, scissor away edges",			Vec4(0.1f, 0.1f, 0.8f, 0.8f)));
	addChild(createFramebufferBlitTest(tc, rc, "framebuffer_blit_corner",	"Blit to default framebuffer, scissor all but a corner",	Vec4(0.6f, 0.6f, 0.5f, 0.5f)));
	addChild(createFramebufferBlitTest(tc, rc, "framebuffer_blit_none",		"Blit to default framebuffer, scissor area outside screen", Vec4(1.6f, 0.6f, 0.5f, 0.5f)));
}